

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::~Compaction(Compaction *this)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_20;
  Compaction *this_local;
  
  if (this->input_version_ != (Version *)0x0) {
    Version::Unref(this->input_version_);
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (&this->grandparents_);
  local_20 = &this->grandparents_;
  do {
    local_20 = local_20 + -1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              (local_20);
  } while (local_20 != this->inputs_);
  VersionEdit::~VersionEdit(&this->edit_);
  return;
}

Assistant:

Compaction::~Compaction() {
  if (input_version_ != nullptr) {
    input_version_->Unref();
  }
}